

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

int32 __thiscall rw::MaterialList::findIndex(MaterialList *this,Material *mat)

{
  long lVar1;
  
  if (0 < (long)this->numMaterials) {
    lVar1 = 0;
    do {
      if (this->materials[lVar1] == mat) {
        return (int32)lVar1;
      }
      lVar1 = lVar1 + 1;
    } while (this->numMaterials != lVar1);
  }
  return -1;
}

Assistant:

int32
MaterialList::findIndex(Material *mat)
{
	for(int32 i = 0; i < this->numMaterials; i++)
		if(this->materials[i] == mat)
			return i;
	return -1;
}